

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

_func_void_StatsAccumulator_ptr * __thiscall
pbrt::$_16::operator_cast_to_function_pointer(__16 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  return pbrt::anon_class_1_0_00000001::__invoke;
}

Assistant:

BasicSceneBuilder::BasicSceneBuilder(BasicScene *scene)
    : scene(scene)
#ifdef PBRT_BUILD_GPU_RENDERER
      ,
      transformCache(Options->useGPU ? Allocator(&CUDATrackedMemoryResource::singleton)
                                     : Allocator())
#endif
{
    // Set scene defaults
    camera.name = SceneEntity::internedStrings.Lookup("perspective");
    sampler.name = SceneEntity::internedStrings.Lookup("zsobol");
    filter.name = SceneEntity::internedStrings.Lookup("gaussian");
    integrator.name = SceneEntity::internedStrings.Lookup("volpath");
    accelerator.name = SceneEntity::internedStrings.Lookup("bvh");

    film.name = SceneEntity::internedStrings.Lookup("rgb");
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);

    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    currentMaterialIndex = scene->AddMaterial(SceneEntity("diffuse", dict, {}));
}